

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdToTruth_rec(char *pStr,char **p,int *pMatches,word **pTtElems,word *pRes,int nVars)

{
  char cVar1;
  int nWordsR;
  int nVars_00;
  int iVar2;
  char *pcVar3;
  int local_2484;
  int nVarsF;
  int i_1;
  char *q_3;
  word pFunc [64];
  word pFanins [12] [64];
  int local_a6c;
  int i;
  word pTtTemp_2 [3] [64];
  char *q_2;
  word pTtTemp_1 [64];
  char *q_1;
  word pTtTemp [64];
  char *q;
  int fCompl;
  int nWords;
  int nVars_local;
  word *pRes_local;
  word **pTtElems_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  nWordsR = Abc_TtWordNum(nVars);
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  q._4_4_ = (uint)(cVar1 == '!');
  if ((**p < 'a') || ('z' < **p)) {
    if (**p == '(') {
      pTtTemp[0x3f] = (word)(pStr + pMatches[(long)*p - (long)pStr]);
      if ((**p != '(') || (*(char *)pTtTemp[0x3f] != ')')) {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x227,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      Abc_TtConst1(pRes,nWordsR);
      *p = *p + 1;
      while (*p < pTtTemp[0x3f]) {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,(word *)&q_1,nVars);
        Abc_TtAnd(pRes,pRes,(word *)&q_1,nWordsR,0);
        *p = *p + 1;
      }
      if (*p != (char *)pTtTemp[0x3f]) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x22e,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (q._4_4_ != 0) {
        Abc_TtNot(pRes,nWordsR);
      }
    }
    else if (**p == '[') {
      pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '[') || (*pcVar3 != ']')) {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x236,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      Abc_TtConst0(pRes,nWordsR);
      *p = *p + 1;
      while (*p < pcVar3) {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,(word *)&q_2,nVars);
        Abc_TtXor(pRes,pRes,(word *)&q_2,nWordsR,0);
        *p = *p + 1;
      }
      if (*p != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x23d,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (q._4_4_ != 0) {
        Abc_TtNot(pRes,nWordsR);
      }
    }
    else if (**p == '<') {
      pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '<') || (*pcVar3 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x246,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      local_a6c = 0;
      *p = *p + 1;
      while (*p < pcVar3) {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,
                           (word *)(&stack0xfffffffffffff598 + (long)local_a6c * 0x200),nVars);
        *p = *p + 1;
        local_a6c = local_a6c + 1;
      }
      if (local_a6c != 3) {
        __assert_fail("i == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x249,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      Abc_TtMux(pRes,(word *)&stack0xfffffffffffff598,pTtTemp_2[0] + 0x3f,pTtTemp_2[1] + 0x3f,
                nWordsR);
      if (*p != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x24b,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (q._4_4_ != 0) {
        Abc_TtNot(pRes,nWordsR);
      }
    }
    else {
      if (((**p < 'A') || ('F' < **p)) && ((**p < '0' || ('9' < **p)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x25f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      nVars_00 = Abc_TtReadHex((word *)&q_3,*p);
      iVar2 = Abc_TtHexDigitNum(nVars_00);
      *p = *p + iVar2;
      pcVar3 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '{') || (*pcVar3 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x256,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      local_2484 = 0;
      *p = *p + 1;
      while (*p < pcVar3) {
        Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pFanins[(long)local_2484 + -1] + 0x3f,nVars);
        *p = *p + 1;
        local_2484 = local_2484 + 1;
      }
      if (local_2484 != nVars_00) {
        __assert_fail("i == nVarsF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x259,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      if (*p != pcVar3) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x25a,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)"
                     );
      }
      Dau_DsdTruthCompose_rec((word *)&q_3,(word (*) [64])(pFunc + 0x3f),pRes,nVars_00,nWordsR);
      if (q._4_4_ != 0) {
        Abc_TtNot(pRes,nWordsR);
      }
    }
  }
  else {
    if ((**p + -0x61 < 0) || (nVars <= **p + -0x61)) {
      __assert_fail("**p - \'a\' >= 0 && **p - \'a\' < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x21f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Abc_TtCopy(pRes,pTtElems[**p + -0x61],nWordsR,q._4_4_);
  }
  return;
}

Assistant:

void Dau_DsdToTruth_rec( char * pStr, char ** p, int * pMatches, word ** pTtElems, word * pRes, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < nVars );
        Abc_TtCopy( pRes, pTtElems[**p - 'a'], nWords, fCompl );
        return;
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '(' && *q == ')' );
        Abc_TtConst1( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtAnd( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '[' && *q == ']' );
        Abc_TtConst0( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtXor( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '<' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[3][DAU_MAX_WORD];
        int i;
        assert( **p == '<' && *q == '>' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp[i], nVars );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], nWords );
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], pFunc[DAU_MAX_WORD];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pFanins[i], nVars );
        assert( i == nVarsF );
        assert( *p == q );
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVarsF, nWords );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    assert( 0 );
}